

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

void gba_system_loop(void)

{
  arm7tdmi_t *paVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int line;
  int iVar5;
  gba_apu_t *pgVar6;
  gba_ppu_t *ctx;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if (should_quit) {
    free(mem->backup);
    free(mem->backup_path);
    lVar4 = 0;
    do {
      free(mem->savestate_path[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    free(mem->savestate_path);
    free(mem->rom);
    free(mem);
    mem = (gbamem_t *)0x0;
    free(ppu);
    ppu = (gba_ppu_t *)0x0;
    free(bus);
    bus = (gbabus_t *)0x0;
    free(apu);
    apu = (gba_apu_t *)0x0;
    free(cpu);
    cpu = (arm7tdmi_t *)0x0;
    return;
  }
  iVar5 = 0;
  iVar7 = 0;
  do {
    iVar8 = iVar7 + 0x3c0;
    iVar9 = iVar8;
    if (-0x3c0 < iVar7) {
      do {
        paVar1 = cpu;
        cpu_stepped = false;
        bVar10 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar10;
        if ((~paVar1->halt & 1U) == 0 && !bVar10) {
          iVar7 = 1;
          timer_tick(1);
          pgVar6 = apu;
          iVar2 = iVar7;
LAB_0010634a:
          do {
            uVar3 = pgVar6->apu_cycle_counter + 1;
            pgVar6->apu_cycle_counter = uVar3;
            if (0x15d < uVar3) {
              pgVar6->apu_cycle_counter = 0;
              apu_push_sample(pgVar6);
              pgVar6 = apu;
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        else {
          cpu_stepped = true;
          iVar2 = arm7tdmi_step(paVar1);
          timer_tick(iVar2);
          pgVar6 = apu;
          iVar7 = iVar2;
          if (0 < iVar2) goto LAB_0010634a;
        }
        iVar8 = iVar9 - iVar2;
        bVar10 = iVar2 <= iVar9;
        iVar9 = iVar8;
      } while (iVar8 != 0 && bVar10);
    }
    ppu_hblank(ppu);
    iVar7 = iVar8 + 0x110;
    iVar9 = iVar7;
    if (-0x110 < iVar8) {
      do {
        paVar1 = cpu;
        cpu_stepped = false;
        bVar10 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
        cpu->irq = bVar10;
        if ((~paVar1->halt & 1U) == 0 && !bVar10) {
          iVar7 = 1;
          timer_tick(1);
          pgVar6 = apu;
          iVar8 = iVar7;
LAB_0010640d:
          do {
            uVar3 = pgVar6->apu_cycle_counter + 1;
            pgVar6->apu_cycle_counter = uVar3;
            if (0x15d < uVar3) {
              pgVar6->apu_cycle_counter = 0;
              apu_push_sample(pgVar6);
              pgVar6 = apu;
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        else {
          cpu_stepped = true;
          iVar8 = arm7tdmi_step(paVar1);
          timer_tick(iVar8);
          pgVar6 = apu;
          iVar7 = iVar8;
          if (0 < iVar8) goto LAB_0010640d;
        }
        iVar7 = iVar9 - iVar8;
        bVar10 = iVar8 <= iVar9;
        iVar9 = iVar7;
      } while (iVar7 != 0 && bVar10);
    }
    ppu_end_hblank(ppu);
    iVar5 = iVar5 + 1;
    if (iVar5 == 0xa0) {
      ppu_vblank(ppu);
      iVar5 = 0;
      do {
        iVar9 = iVar7 + 0x3c0;
        iVar8 = iVar9;
        if (-0x3c0 < iVar7) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar10 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar10;
            if ((~paVar1->halt & 1U) == 0 && !bVar10) {
              iVar7 = 1;
              timer_tick(1);
              pgVar6 = apu;
              iVar2 = iVar7;
LAB_001064ec:
              do {
                uVar3 = pgVar6->apu_cycle_counter + 1;
                pgVar6->apu_cycle_counter = uVar3;
                if (0x15d < uVar3) {
                  pgVar6->apu_cycle_counter = 0;
                  apu_push_sample(pgVar6);
                  pgVar6 = apu;
                }
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            else {
              cpu_stepped = true;
              iVar2 = arm7tdmi_step(paVar1);
              timer_tick(iVar2);
              pgVar6 = apu;
              iVar7 = iVar2;
              if (0 < iVar2) goto LAB_001064ec;
            }
            iVar9 = iVar8 - iVar2;
            bVar10 = iVar2 <= iVar8;
            iVar8 = iVar9;
          } while (iVar9 != 0 && bVar10);
        }
        ppu_hblank(ppu);
        iVar7 = iVar9 + 0x110;
        iVar8 = iVar7;
        if (-0x110 < iVar9) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar10 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar10;
            if ((~paVar1->halt & 1U) == 0 && !bVar10) {
              iVar7 = 1;
              timer_tick(1);
              pgVar6 = apu;
              iVar9 = iVar7;
LAB_001065af:
              do {
                uVar3 = pgVar6->apu_cycle_counter + 1;
                pgVar6->apu_cycle_counter = uVar3;
                if (0x15d < uVar3) {
                  pgVar6->apu_cycle_counter = 0;
                  apu_push_sample(pgVar6);
                  pgVar6 = apu;
                }
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            else {
              cpu_stepped = true;
              iVar9 = arm7tdmi_step(paVar1);
              timer_tick(iVar9);
              pgVar6 = apu;
              iVar7 = iVar9;
              if (0 < iVar9) goto LAB_001065af;
            }
            iVar7 = iVar8 - iVar9;
            bVar10 = iVar9 <= iVar8;
            iVar8 = iVar7;
          } while (iVar7 != 0 && bVar10);
        }
        ppu_end_hblank(ppu);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0x44);
      ctx = ppu;
      ppu_end_vblank(ppu);
      persist_backup();
      iVar5 = 0;
      if (should_quit != false) {
        cleanup((EVP_PKEY_CTX *)ctx);
        return;
      }
    }
  } while( true );
}

Assistant:

void gba_system_loop() {
    int extra = 0;
    while (!should_quit) {
        for (int line = 0; line < VISIBLE_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_vblank(ppu);
        for (int line = 0; line < VBLANK_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_end_vblank(ppu);
        persist_backup();
    }

    cleanup();
}